

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

bool __thiscall CaptureSummary::Load(CaptureSummary *this,char *file_name)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  bool bVar3;
  int local_2f8;
  bool local_2f1;
  int start;
  bool ret;
  FILE *F;
  char buffer [512];
  CaptureLine line;
  char *file_name_local;
  CaptureSummary *this_local;
  
  line.count = (uint64_t)file_name;
  __stream = (FILE *)ithi_file_open(file_name,"r");
  local_2f1 = __stream != (FILE *)0x0;
  while( true ) {
    bVar3 = false;
    if (local_2f1 != false) {
      pcVar2 = fgets((char *)&F,0x200,__stream);
      bVar3 = pcVar2 != (char *)0x0;
    }
    if (!bVar3) break;
    iVar1 = CsvHelper::read_string(buffer + 0x1f8,0x40,0,(char *)&F,0x200);
    iVar1 = CsvHelper::read_number((int *)(line.registry_name + 0x38),(long)iVar1,(char *)&F,0x200);
    if (line.registry_name._56_4_ == 0) {
      local_2f8 = CsvHelper::read_number
                            ((int *)(line.registry_name + 0x3c),(long)iVar1,(char *)&F,0x200);
    }
    else {
      local_2f8 = CsvHelper::read_string
                            (line.registry_name + 0x3c,0x80,(long)iVar1,(char *)&F,0x200);
    }
    CsvHelper::read_number64
              ((uint64_t *)(line.field_2.key_value + 0x7c),(long)local_2f8,(char *)&F,0x200);
    pcVar2 = DnsStats::GetTableName(0);
    iVar1 = strcmp(buffer + 0x1f8,pcVar2);
    if (iVar1 == 0) {
      this->capture_version = line.field_2._124_4_;
    }
    else {
      local_2f1 = AddLine(this,(CaptureLine *)(buffer + 0x1f8),true);
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return local_2f1;
}

Assistant:

bool CaptureSummary::Load(char const * file_name)
{
    CaptureLine line;
    char buffer[512];
    FILE * F = ithi_file_open(file_name, "r");
    bool ret = (F != NULL);

    while ( ret && fgets(buffer, sizeof(buffer), F))
    {
        int start = 0;
        start = CsvHelper::read_string(line.registry_name, sizeof(line.registry_name), start, buffer, sizeof(buffer));
        start = CsvHelper::read_number(&line.key_type, start, buffer, sizeof(buffer));
        if (line.key_type == 0)
        {
            start = CsvHelper::read_number(&line.key_number, start, buffer, sizeof(buffer));
        }
        else
        {
            start = CsvHelper::read_string(line.key_value, sizeof(line.key_value), start, buffer, sizeof(buffer));
        }
        (void)CsvHelper::read_number64(&line.count, start, buffer, sizeof(buffer));


        /* TODO: check that the parsing is good */

        /* Notice the version number */
        if (strcmp(line.registry_name, DnsStats::GetTableName(REGISTRY_ITHITOOLS_VERSION)) == 0) {
            capture_version = (int) line.count;
        } else {
            /* allocate data and add to vector */
            ret = AddLine(&line, true);
        }
    }

    if (F != NULL)
    {
        fclose(F);
    }
    return ret;
}